

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_fadd_tricore(CPUTriCoreState *env,uint32_t r1,uint32_t r2)

{
  byte flags_00;
  int iVar1;
  float32 local_28;
  float32 f_result;
  uint32_t flags;
  float32 arg2;
  float32 arg1;
  uint32_t r2_local;
  uint32_t r1_local;
  CPUTriCoreState *env_local;
  
  local_28 = float32_add_tricore(r2,r1,&env->fp_status);
  flags_00 = f_get_excp_flags(env);
  if (flags_00 == 0) {
    env->PSW_USB_C = 0;
  }
  else {
    if ((flags_00 & 1) != 0) {
      iVar1 = float32_is_any_nan(r1);
      if (iVar1 == 0) {
        iVar1 = float32_is_any_nan(r2);
        if (iVar1 == 0) {
          local_28 = 0x7fc00001;
        }
      }
    }
    f_update_psw_flags(env,flags_00);
  }
  return local_28;
}

Assistant:

FADD_SUB(add)
FADD_SUB(sub)

uint32_t helper_fmul(CPUTriCoreState *env, uint32_t r1, uint32_t r2)
{
    uint32_t flags;
    float32 arg1 = make_float32(r1);
    float32 arg2 = make_float32(r2);
    float32 f_result;

    f_result = float32_mul(arg1, arg2, &env->fp_status);

    flags = f_get_excp_flags(env);
    if (flags) {
        /* If the output is a NaN, but the inputs aren't,
           we return a unique value.  */
        if ((flags & float_flag_invalid)
            && !float32_is_any_nan(arg1)
            && !float32_is_any_nan(arg2)) {
                f_result = MUL_NAN;
        }
        f_update_psw_flags(env, flags);
    } else {
        env->FPU_FS = 0;
    }
    return (uint32_t)f_result;

}